

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O0

void __thiscall
sentencepiece::normalizer::Normalizer::Normalizer
          (Normalizer *this,NormalizerSpec *spec,TrainerSpec *trainer_spec)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Normalizer *in_stack_00000050;
  
  *in_RDI = &PTR__Normalizer_006f1578;
  std::
  unique_ptr<Darts::DoubleArrayImpl<void,void,int,void>,std::default_delete<Darts::DoubleArrayImpl<void,void,int,void>>>
  ::unique_ptr<std::default_delete<Darts::DoubleArrayImpl<void,void,int,void>>,void>
            ((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
              *)(in_RDI + 1));
  in_RDI[2] = 0;
  in_RDI[3] = in_RSI;
  in_RDI[4] = 0;
  bVar1 = TrainerSpec::treat_whitespace_as_suffix((TrainerSpec *)0x474a6a);
  *(bool *)(in_RDI + 5) = bVar1;
  util::OkStatus();
  Init(in_stack_00000050);
  return;
}

Assistant:

Normalizer::Normalizer(const NormalizerSpec &spec,
                       const TrainerSpec &trainer_spec)
    : spec_(&spec),
      treat_whitespace_as_suffix_(trainer_spec.treat_whitespace_as_suffix()),
      status_(util::OkStatus()) {
  Init();
}